

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O3

string * __thiscall
iDynTree::Direction::toString_abi_cxx11_(string *__return_storage_ptr__,Direction *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190," x ",3);
  poVar1 = std::ostream::_M_insert<double>((this->super_Vector3).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," y ",3);
  poVar1 = std::ostream::_M_insert<double>((this->super_Vector3).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," z ",3);
  std::ostream::_M_insert<double>((this->super_Vector3).m_data[2]);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Direction::toString() const
    {
        std::stringstream ss;

        ss << " x " << this->m_data[0]
        << " y " << this->m_data[1]
        << " z " << this->m_data[2];

        return ss.str();
    }